

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

bool stackjit::TypeSystem::areEqual
               (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1,
               vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2)

{
  pointer ppTVar1;
  bool bVar2;
  pointer ppTVar3;
  ulong uVar4;
  
  ppTVar3 = (list1->
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (list1->
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if ((long)ppTVar1 - (long)ppTVar3 ==
      (long)(list2->
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(list2->
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>).
            _M_impl.super__Vector_impl_data._M_start) {
    if (ppTVar1 == ppTVar3) {
      bVar2 = true;
    }
    else {
      uVar4 = 0;
      do {
        bVar2 = Type::operator==(ppTVar3[uVar4],
                                 (list2->
                                 super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar4]);
        if (!bVar2) {
          return bVar2;
        }
        uVar4 = uVar4 + 1;
        ppTVar3 = (list1->
                  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(list1->
                                     super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >>
                              3));
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TypeSystem::areEqual(const std::vector<const Type*>& list1, const std::vector<const Type*>& list2) {
		if (list1.size() != list2.size()) {
			return false;
		}

		for (std::size_t i = 0; i < list1.size(); i++) {
			if (*list1[i] != *list2[i]) {
				return false;
			}
		}

		return true;
	}